

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

Writer * __thiscall el::base::Writer::construct(Writer *this,Logger *logger,bool needLock)

{
  char *pcVar1;
  
  this->m_logger = logger;
  initializeLogger(this,&logger->m_id,false,needLock);
  (this->m_messageBuilder).m_logger = this->m_logger;
  pcVar1 = "\n    ";
  if ((*(byte *)(elStorage + 0x18) & 1) == 0) {
    pcVar1 = ", ";
  }
  (this->m_messageBuilder).m_containerLogSeperator = pcVar1;
  return this;
}

Assistant:

Writer& Writer::construct(Logger* logger, bool needLock) {
  m_logger = logger;
  initializeLogger(logger->id(), false, needLock);
  m_messageBuilder.initialize(m_logger);
  return *this;
}